

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_string_radix_sort.h
# Opt level: O1

void __thiscall
parallel_string_radix_sort::ParallelStringRadixSort<const_unsigned_char_*>::Sort16
          (ParallelStringRadixSort<const_unsigned_char_*> *this,size_t bgn,size_t end,size_t depth,
          bool flip)

{
  long *plVar1;
  uchar uVar2;
  uint16_t *puVar3;
  long lVar4;
  uchar *puVar5;
  uchar **ppuVar6;
  int i_1;
  void *__s;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  size_t sVar11;
  uchar **ppuVar12;
  size_t bgn_00;
  uint16_t uVar13;
  long lVar14;
  size_t sVar15;
  undefined7 in_register_00000081;
  size_t i_2;
  
  __s = operator_new__(0x80000);
  memset(__s,0,0x80000);
  ppuVar12 = this->temp_;
  ppuVar6 = this->data_;
  if ((int)CONCAT71(in_register_00000081,flip) != 0) {
    ppuVar12 = this->data_;
    ppuVar6 = this->temp_;
  }
  puVar3 = this->letters16_;
  sVar11 = bgn;
  if (end != bgn) {
    do {
      uVar2 = ppuVar6[sVar11][depth];
      if (uVar2 == '\0') {
        uVar13 = 0;
      }
      else {
        uVar13 = CONCAT11(uVar2,ppuVar6[sVar11][depth + 1]);
      }
      puVar3[sVar11] = uVar13;
      sVar11 = sVar11 + 1;
    } while (end != sVar11);
  }
  sVar11 = bgn;
  if (end != bgn) {
    do {
      plVar1 = (long *)((long)__s + (ulong)puVar3[sVar11] * 8);
      *plVar1 = *plVar1 + 1;
      sVar11 = sVar11 + 1;
    } while (end != sVar11);
  }
  lVar14 = 0;
  lVar7 = 0;
  do {
    lVar4 = *(long *)((long)__s + lVar14 * 8);
    *(long *)((long)__s + lVar14 * 8) = lVar7;
    lVar14 = lVar14 + 1;
    lVar7 = lVar4 + lVar7;
  } while (lVar14 != 0x10000);
  sVar11 = bgn;
  if (end != bgn) {
    do {
      lVar7 = *(long *)((long)__s + (ulong)puVar3[sVar11] * 8);
      *(long *)((long)__s + (ulong)puVar3[sVar11] * 8) = lVar7 + 1;
      puVar5 = ppuVar12[bgn + lVar7];
      ppuVar12[bgn + lVar7] = ppuVar6[sVar11];
      ppuVar6[sVar11] = puVar5;
      sVar11 = sVar11 + 1;
    } while (end != sVar11);
  }
  if (!flip) {
    lVar7 = 0;
    do {
      if (lVar7 == 0) {
        uVar9 = 0;
      }
      else {
        uVar9 = *(ulong *)((long)__s + lVar7 * 0x800 + -8);
      }
      uVar8 = *(ulong *)((long)__s + lVar7 * 0x800);
      if (uVar9 < uVar8) {
        do {
          puVar5 = ppuVar6[bgn + uVar9];
          ppuVar6[bgn + uVar9] = ppuVar12[bgn + uVar9];
          ppuVar12[bgn + uVar9] = puVar5;
          uVar9 = uVar9 + 1;
        } while (uVar8 != uVar9);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x100);
  }
  uVar9 = depth + 2;
  lVar7 = 1;
  do {
    if ((char)lVar7 != '\0') {
      lVar14 = *(long *)((long)__s + lVar7 * 8 + -8);
      lVar4 = *(long *)((long)__s + lVar7 * 8);
      uVar8 = lVar4 - lVar14;
      if (uVar8 != 0) {
        bgn_00 = lVar14 + bgn;
        sVar11 = lVar4 + bgn;
        if ((uVar9 < 100) && (0x1e < uVar8)) {
          if (uVar8 < 0x10000) {
            Sort8(this,bgn_00,sVar11,uVar9,!flip);
          }
          else {
            Sort16(this,bgn_00,sVar11,uVar9,!flip);
          }
        }
        else {
          uVar10 = uVar8;
          sVar15 = bgn_00;
          if (bgn_00 < sVar11 && !flip) {
            do {
              ppuVar6 = this->temp_;
              puVar5 = this->data_[sVar15];
              this->data_[sVar15] = ppuVar6[sVar15];
              ppuVar6[sVar15] = puVar5;
              uVar10 = uVar10 - 1;
              sVar15 = sVar15 + 1;
            } while (uVar10 != 0);
          }
          if (1 < uVar8) {
            ppuVar6 = this->data_ + sVar11;
            ppuVar12 = this->data_ + bgn_00;
            uVar8 = (long)(sVar11 * 8 + bgn_00 * -8) >> 3;
            lVar14 = 0x3f;
            if (uVar8 != 0) {
              for (; uVar8 >> lVar14 == 0; lVar14 = lVar14 + -1) {
              }
            }
            std::
            __introsort_loop<unsigned_char_const**,long,__gnu_cxx::__ops::_Iter_comp_iter<parallel_string_radix_sort::internal::Compare<unsigned_char_const*>>>
                      (ppuVar12,ppuVar6,(ulong)(((uint)lVar14 ^ 0x3f) * 2) ^ 0x7e,
                       (_Iter_comp_iter<parallel_string_radix_sort::internal::Compare<const_unsigned_char_*>_>
                        )(int)uVar9);
            std::
            __final_insertion_sort<unsigned_char_const**,__gnu_cxx::__ops::_Iter_comp_iter<parallel_string_radix_sort::internal::Compare<unsigned_char_const*>>>
                      (ppuVar12,ppuVar6,(Compare<const_unsigned_char_*>)(int)uVar9);
          }
        }
      }
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x10000);
  operator_delete__(__s);
  return;
}

Assistant:

void ParallelStringRadixSort<StringType>
::Sort16(size_t bgn, size_t end, size_t depth, bool flip) {
  size_t *cnt = new size_t[1 << 16]();
  PSRS_CHECK(cnt != NULL);

  StringType *src = (flip ? temp_ : data_) + bgn;
  StringType *dst = (flip ? data_ : temp_) + bgn;
  uint16_t *let = letters16_ + bgn;
  size_t n = end - bgn;

  for (size_t i = 0; i < n; ++i) {
    uint16_t x = src[i][depth];
    let[i] = x == 0 ? 0 : ((x << 8) | src[i][depth + 1]);
  }

  for (size_t i = 0; i < n; ++i) {
    ++cnt[let[i]];
  }

  size_t s = 0;
  for (int i = 0; i < 1 << 16; ++i) {
    std::swap(cnt[i], s);
    s += cnt[i];
  }

  for (size_t i = 0; i < n; ++i) {
    std::swap(dst[cnt[let[i]]++], src[i]);
  }

  if (flip == false) {
    for (int i = 0; i < 1 << 8; ++i) {
      size_t b = i == 0 ? 0 : cnt[(i << 8) - 1];
      size_t e = cnt[i << 8];
      for (size_t j = b; j < e; ++j) {
        std::swap(src[j], dst[j]);
      }
    }
  }

  for (size_t i = 1; i < 1 << 16; ++i) {
    if ((i & 0xFF) != 0 && cnt[i] - cnt[i - 1] >= 1) {
      Recurse(bgn + cnt[i - 1], bgn + cnt[i], depth + 2, !flip);
    }
  }

  delete [] cnt;
}